

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::PrepareStopJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  ErrorCode EVar1;
  pointer puVar2;
  uint64_t uVar3;
  bool bVar4;
  char cVar5;
  iterator iVar6;
  Error *pEVar7;
  string *aMessage;
  pointer __k;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  utils::ToLower((string *)local_98,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,"stop");
  std::__cxx11::string::~string((string *)local_98);
  if (!bVar4) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0x105,
                  "Error ot::commissioner::JobManager::PrepareStopJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __k = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (__k == puVar2) {
      return __return_storage_ptr__;
    }
    iVar6 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
            ::find(&(this->mCommissionerPool)._M_t,__k);
    if ((_Rb_tree_header *)iVar6._M_node ==
        &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header) {
      if (!aGroupAlias) {
        uVar3 = *__k;
        std::__cxx11::string::string
                  ((string *)&local_50,"not known to be started",(allocator *)local_98);
        aMessage = &local_50;
        WarningMsg(this,uVar3,aMessage);
LAB_00141932:
        std::__cxx11::string::~string((string *)aMessage);
      }
    }
    else {
      cVar5 = (**(code **)(*(long *)iVar6._M_node[1]._M_parent + 0x78))();
      if (cVar5 == '\0') {
        if (!aGroupAlias) {
          uVar3 = *__k;
          std::__cxx11::string::string((string *)&local_70,"already stopped",(allocator *)local_98);
          aMessage = &local_70;
          InfoMsg(this,uVar3,aMessage);
          goto LAB_00141932;
        }
      }
      else {
        CreateJob((Error *)local_98,this,(CommissionerAppPtr *)&iVar6._M_node[1]._M_parent,aExpr,
                  *__k);
        pEVar7 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
        EVar1 = pEVar7->mCode;
        std::__cxx11::string::~string((string *)(local_98 + 8));
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
      }
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

Error JobManager::PrepareStopJobs(const Interpreter::Expression &aExpr,
                                  const std::vector<uint64_t>   &aNids,
                                  bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "stop");

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not known to be started");
            }
            continue;
        }

        bool active = entry->second->IsActive();
        if (!active)
        {
            if (!aGroupAlias)
            {
                InfoMsg(nid, "already stopped");
            }
            continue;
        }

        SuccessOrExit(error = CreateJob(entry->second, aExpr, nid));
    }
exit:
    return error;
}